

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

bool __thiscall
wasm::ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
          (ValidationInfo *this,Type left,Type right,Name curr,char *text,Function *func)

{
  ostream *poVar1;
  Name curr_00;
  ostringstream local_1d8 [8];
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char *local_40;
  size_t local_38;
  
  local_40 = curr.super_IString.str._M_str;
  local_38 = curr.super_IString.str._M_len;
  if (left.id == right.id) {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar1 = wasm::operator<<((ostream *)local_1d8,left);
    poVar1 = std::operator<<(poVar1," == ");
    poVar1 = wasm::operator<<(poVar1,left);
    poVar1 = std::operator<<(poVar1,": ");
    std::operator<<(poVar1,text);
    std::__cxx11::stringbuf::str();
    curr_00.super_IString.str._M_str = local_40;
    curr_00.super_IString.str._M_len = local_38;
    fail<wasm::Name,std::__cxx11::string>(this,&local_60,curr_00,func);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  return left.id != right.id;
}

Assistant:

bool shouldBeUnequal(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left == right) {
      std::ostringstream ss;
      ss << left << " == " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }